

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  byte local_129;
  undefined1 local_c8 [7];
  bool decoding_raw;
  ParseArgumentStatus local_84;
  int local_80;
  ParseArgumentStatus status;
  undefined1 local_70 [8];
  string value;
  string name;
  int i;
  char **argv_local;
  int argc_local;
  CommandLineInterface *this_local;
  
  std::__cxx11::string::operator=((string *)this,*argv);
  name.field_2._12_4_ = 1;
  do {
    if (argc <= (int)name.field_2._12_4_) {
      bVar1 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&this->proto_path_);
      if (bVar1) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_c8,(char (*) [1])0x381403,(char (*) [2])0x39ffc2);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(&this->proto_path_,
                    (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_c8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_c8);
      }
      local_129 = 0;
      if (this->mode_ == MODE_DECODE) {
        local_129 = std::__cxx11::string::empty();
      }
      if (((local_129 & 1) == 0) ||
         (bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&this->input_files_), bVar1)) {
        if (((local_129 & 1) == 0) &&
           (bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty(&this->input_files_), bVar1)) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Missing input file.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          this_local._4_4_ = PARSE_ARGUMENT_FAIL;
        }
        else if (((this->mode_ == MODE_COMPILE) &&
                 (bVar1 = std::
                          vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                          ::empty(&this->output_directives_), bVar1)) &&
                (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Missing output directives.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          this_local._4_4_ = PARSE_ARGUMENT_FAIL;
        }
        else {
          if (((this->imports_in_descriptor_set_ & 1U) != 0) &&
             (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
            poVar2 = std::operator<<((ostream *)&std::cerr,
                                     "--include_imports only makes sense when combined with --descriptor_set_out."
                                    );
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          }
          if (((this->source_info_in_descriptor_set_ & 1U) != 0) &&
             (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
            poVar2 = std::operator<<((ostream *)&std::cerr,
                                     "--include_source_info only makes sense when combined with --descriptor_set_out."
                                    );
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          }
          this_local._4_4_ = PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "When using --decode_raw, no input files should be given.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      }
      return this_local._4_4_;
    }
    std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_70);
    bVar1 = ParseArgument(this,argv[(int)name.field_2._12_4_],
                          (string *)(value.field_2._M_local_buf + 8),(string *)local_70);
    if (bVar1) {
      if ((name.field_2._12_4_ + 1 != argc) && (*argv[name.field_2._12_4_ + 1] != '-')) {
        name.field_2._12_4_ = name.field_2._12_4_ + 1;
        std::__cxx11::string::operator=((string *)local_70,argv[(int)name.field_2._12_4_]);
        goto LAB_0023172c;
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,"Missing value for flag: ");
      poVar2 = std::operator<<(poVar2,(string *)(value.field_2._M_local_buf + 8));
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&value.field_2 + 8),"--decode");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "To decode an unknown message, use --decode_raw.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      local_80 = 1;
    }
    else {
LAB_0023172c:
      local_84 = InterpretArgument(this,(string *)((long)&value.field_2 + 8),(string *)local_70);
      if (local_84 == PARSE_ARGUMENT_DONE_AND_CONTINUE) {
        local_80 = 0;
      }
      else {
        local_80 = 1;
        this_local._4_4_ = local_84;
      }
    }
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
    if (local_80 != 0) {
      return this_local._4_4_;
    }
    name.field_2._12_4_ = name.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::ParseArguments(int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  // Iterate through all arguments and parse them.
  for (int i = 1; i < argc; i++) {
    string name, value;

    if (ParseArgument(argv[i], &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == argc || argv[i+1][0] == '-') {
        cerr << "Missing value for flag: " << name << endl;
        if (name == "--decode") {
          cerr << "To decode an unknown message, use --decode_raw." << endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = argv[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE)
      return status;
  }

  // If no --proto_path was given, use the current working directory.
  if (proto_path_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(pair<string, string>("", "."));
  }

  // Check some errror cases.
  bool decoding_raw = (mode_ == MODE_DECODE) && codec_type_.empty();
  if (decoding_raw && !input_files_.empty()) {
    cerr << "When using --decode_raw, no input files should be given." << endl;
    return PARSE_ARGUMENT_FAIL;
  } else if (!decoding_raw && input_files_.empty()) {
    cerr << "Missing input file." << endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_name_.empty()) {
    cerr << "Missing output directives." << endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_name_.empty()) {
    cerr << "--include_imports only makes sense when combined with "
            "--descriptor_set_out." << endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_name_.empty()) {
    cerr << "--include_source_info only makes sense when combined with "
            "--descriptor_set_out." << endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}